

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O3

void __thiscall
FIX::HttpConnection::processResetSession
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  char *pcVar1;
  Parameters *this_00;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  undefined *puVar4;
  stringstream *psVar5;
  int iVar6;
  string *psVar7;
  const_iterator cVar8;
  Session *this_01;
  A *pAVar9;
  long *plVar10;
  TAG *pTVar11;
  size_t sVar12;
  SessionNotFound *this_02;
  _func_int **pp_Var13;
  ostream *poVar14;
  bool bVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar16;
  string sessionQualifier;
  string targetCompID;
  string senderCompID;
  string beginString;
  string sessionUrl;
  CENTER center;
  HttpMessage copy;
  H2 h2;
  SessionID sessionID;
  A a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  stringstream *local_7e8;
  long *local_7e0;
  long local_7d8;
  long local_7d0 [2];
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  stringstream *local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  undefined1 local_6f8 [432];
  ostream *local_548;
  HttpMessage local_540;
  undefined1 local_4f0 [432];
  ostream *local_340;
  SessionID local_338;
  undefined1 local_1e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1d0 [26];
  
  local_7e8 = b;
  HttpMessage::HttpMessage(&local_540,request);
  pcVar1 = local_6f8 + 0x10;
  local_6f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"BeginString","");
  psVar7 = HttpMessage::getParameter(request,(string *)local_6f8);
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_740,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((char *)local_6f8._0_8_ != pcVar1) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
  }
  local_6f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"SenderCompID","");
  psVar7 = HttpMessage::getParameter(request,(string *)local_6f8);
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_760,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((char *)local_6f8._0_8_ != pcVar1) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
  }
  local_6f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"TargetCompID","");
  psVar7 = HttpMessage::getParameter(request,(string *)local_6f8);
  local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_780,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((char *)local_6f8._0_8_ != pcVar1) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
  }
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  local_7a0._M_string_length = 0;
  local_7a0.field_2._M_local_buf[0] = '\0';
  local_6f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"SessionQualifier","");
  this_00 = &local_540.m_parameters;
  local_720 = h;
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_6f8);
  p_Var2 = &local_540.m_parameters._M_t._M_impl.super__Rb_tree_header;
  if ((char *)local_6f8._0_8_ != pcVar1) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar8._M_node != p_Var2) {
    local_6f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"SessionQualifier","");
    HttpMessage::getParameter(&local_540,(string *)local_6f8);
    std::__cxx11::string::_M_assign((string *)&local_7a0);
    if ((char *)local_6f8._0_8_ != pcVar1) {
      operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
    }
  }
  SessionID::SessionID(&local_338,&local_740,&local_760,&local_780,&local_7a0);
  this_01 = Session::lookupSession(&local_338);
  if (this_01 != (Session *)0x0) {
    HttpMessage::getParameterString_abi_cxx11_((string *)local_6f8,request);
    std::operator+(&local_718,"/session",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f8);
    if ((char *)local_6f8._0_8_ != pcVar1) {
      operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
    }
    local_6f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"confirm","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,(key_type *)local_6f8);
    if ((_Rb_tree_header *)cVar8._M_node == p_Var2) {
      bVar15 = false;
    }
    else {
      local_4f0._0_8_ = local_4f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"confirm","");
      psVar7 = HttpMessage::getParameter(&local_540,(string *)local_4f0);
      iVar6 = std::__cxx11::string::compare((char *)psVar7);
      bVar15 = iVar6 != 0;
      if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
        operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
      }
    }
    if ((char *)local_6f8._0_8_ != pcVar1) {
      operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
    }
    if (bVar15) {
      Session::reset(this_01);
      psVar5 = local_720;
      local_6f8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"confirm","");
      pVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&this_00->_M_t,(key_type *)local_6f8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar16.first._M_node,(_Base_ptr)pVar16.second._M_node
                    );
      if ((char *)local_6f8._0_8_ != pcVar1) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      poVar14 = (ostream *)(psVar5 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"<META http-equiv=\'refresh\' content=2;URL=\'",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"/session",8);
      HttpMessage::getParameterString_abi_cxx11_((string *)local_6f8,&local_540);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,(char *)local_6f8._0_8_,local_6f8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\'>",2);
      if ((char *)local_6f8._0_8_ != pcVar1) {
        operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
      }
      poVar14 = (ostream *)(local_7e8 + 0x10);
      HTML::CENTER::CENTER((CENTER *)local_6f8,poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(local_548,">",1);
      HTML::H2::H2((H2 *)local_4f0,poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(local_340,">",1);
      HTML::A::A((A *)local_1e8,poVar14);
      HttpMessage::getParameterString_abi_cxx11_(&local_7c0,&local_540);
      std::operator+(&local_808,"/session",&local_7c0);
      pAVar9 = HTML::A::href((A *)local_1e8,&local_808);
      local_7e0 = local_7d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e0,local_338.m_frozenString._M_dataplus._M_p,
                 local_338.m_frozenString._M_dataplus._M_p +
                 local_338.m_frozenString._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(pAVar9->super_TAG).field_0x38,(char *)local_7e0,local_7d8);
      std::__ostream_insert<char,std::char_traits<char>>((pAVar9->super_TAG).m_stream,">",1);
      if (local_7e0 != local_7d0) {
        operator_delete(local_7e0,local_7d0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_808._M_dataplus._M_p != &local_808.field_2) {
        operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
        operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
      }
      HTML::TAG::~TAG((TAG *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," has been reset",0xf);
      HTML::TAG::~TAG((TAG *)local_4f0);
    }
    else {
      poVar14 = (ostream *)(local_7e8 + 0x10);
      HTML::CENTER::CENTER((CENTER *)local_6f8,poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(local_548,">",1);
      HTML::H2::H2((H2 *)local_4f0,poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(local_340,">",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"Are you sure you want to reset session ",0x27);
      HTML::A::A((A *)local_1e8,poVar14);
      HttpMessage::getParameterString_abi_cxx11_(&local_7c0,request);
      std::operator+(&local_808,&local_718,&local_7c0);
      pAVar9 = HTML::A::href((A *)local_1e8,&local_808);
      local_7e0 = local_7d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e0,local_338.m_frozenString._M_dataplus._M_p,
                 local_338.m_frozenString._M_dataplus._M_p +
                 local_338.m_frozenString._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(pAVar9->super_TAG).field_0x38,(char *)local_7e0,local_7d8);
      std::__ostream_insert<char,std::char_traits<char>>((pAVar9->super_TAG).m_stream,">",1);
      if (local_7e0 != local_7d0) {
        operator_delete(local_7e0,local_7d0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_808._M_dataplus._M_p != &local_808.field_2) {
        operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
        operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
      }
      HTML::TAG::~TAG((TAG *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"?",1);
      HTML::TAG::~TAG((TAG *)local_4f0);
      HTML::TAG::~TAG((TAG *)local_6f8);
      HTML::CENTER::CENTER((CENTER *)local_6f8,poVar14);
      std::__ostream_insert<char,std::char_traits<char>>(local_548,">",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"[",1);
      HTML::A::A((A *)local_4f0,poVar14);
      HttpMessage::toString_abi_cxx11_(&local_808,request);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_808);
      pp_Var13 = (_func_int **)(plVar10 + 2);
      if ((_func_int **)*plVar10 == pp_Var13) {
        local_1e8._16_8_ = *pp_Var13;
        aaStack_1d0[0]._0_8_ = plVar10[3];
        local_1e8._0_8_ = local_1e8 + 0x10;
      }
      else {
        local_1e8._16_8_ = *pp_Var13;
        local_1e8._0_8_ = (_func_int **)*plVar10;
      }
      local_1e8._8_8_ = plVar10[1];
      *plVar10 = (long)pp_Var13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      pTVar11 = &HTML::A::href((A *)local_4f0,(string *)local_1e8)->super_TAG;
      HTML::TAG::text<char[19]>(pTVar11,(char (*) [19])"YES, reset session");
      if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_808._M_dataplus._M_p != &local_808.field_2) {
        operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
      }
      HTML::TAG::~TAG((TAG *)local_4f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]",1);
      puVar4 = HTML::NBSP;
      if (HTML::NBSP == (undefined *)0x0) {
        std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
      }
      else {
        sVar12 = strlen(HTML::NBSP);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,puVar4,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"[",1);
      HTML::A::A((A *)local_4f0,poVar14);
      pTVar11 = &HTML::A::href((A *)local_4f0,&local_718)->super_TAG;
      HTML::TAG::text<char[25]>(pTVar11,(char (*) [25])"NO, do not reset session");
      HTML::TAG::~TAG((TAG *)local_4f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]",1);
    }
    HTML::TAG::~TAG((TAG *)local_6f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_718._M_dataplus._M_p != &local_718.field_2) {
      operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_frozenString._M_dataplus._M_p != &local_338.m_frozenString.field_2) {
      operator_delete(local_338.m_frozenString._M_dataplus._M_p,
                      local_338.m_frozenString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_sessionQualifier._M_dataplus._M_p != &local_338.m_sessionQualifier.field_2) {
      operator_delete(local_338.m_sessionQualifier._M_dataplus._M_p,
                      local_338.m_sessionQualifier.field_2._M_allocated_capacity + 1);
    }
    FieldBase::~FieldBase((FieldBase *)&local_338.m_targetCompID);
    FieldBase::~FieldBase((FieldBase *)&local_338.m_senderCompID);
    FieldBase::~FieldBase((FieldBase *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
      operator_delete(local_7a0._M_dataplus._M_p,
                      CONCAT71(local_7a0.field_2._M_allocated_capacity._1_7_,
                               local_7a0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_780._M_dataplus._M_p != &local_780.field_2) {
      operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_760._M_dataplus._M_p != &local_760.field_2) {
      operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_740._M_dataplus._M_p != &local_740.field_2) {
      operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&this_00->_M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540.m_root._M_dataplus._M_p != &local_540.m_root.field_2) {
      operator_delete(local_540.m_root._M_dataplus._M_p,
                      local_540.m_root.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_02 = (SessionNotFound *)__cxa_allocate_exception(0x50);
  local_6f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"");
  SessionNotFound::SessionNotFound(this_02,(string *)local_6f8);
  __cxa_throw(this_02,&SessionNotFound::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void HttpConnection::processResetSession(const HttpMessage &request, std::stringstream &h, std::stringstream &b) {
  try {
    HttpMessage copy = request;
    std::string beginString = request.getParameter("BeginString");
    std::string senderCompID = request.getParameter("SenderCompID");
    std::string targetCompID = request.getParameter("TargetCompID");
    std::string sessionQualifier;
    if (copy.hasParameter("SessionQualifier")) {
      sessionQualifier = copy.getParameter("SessionQualifier");
    }

    SessionID sessionID(beginString, senderCompID, targetCompID, sessionQualifier);
    Session *pSession = Session::lookupSession(sessionID);
    if (pSession == 0) {
      throw SessionNotFound();
    }

    std::string sessionUrl = "/session" + request.getParameterString();

    bool confirm = false;
    if (copy.hasParameter("confirm") && copy.getParameter("confirm") != "0") {
      confirm = true;
      pSession->reset();
      copy.removeParameter("confirm");
    }

    if (confirm) {
      h << "<META http-equiv='refresh' content=2;URL='" << "/session" << copy.getParameterString() << "'>";
      CENTER center(b);
      center.text();
      H2 h2(b);
      h2.text();
      {
        A a(b);
        a.href("/session" + copy.getParameterString()).text(sessionID.toString());
      }
      b << " has been reset";
    } else {
      {
        CENTER center(b);
        center.text();
        H2 h2(b);
        h2.text();
        b << "Are you sure you want to reset session ";
        {
          A a(b);
          a.href(sessionUrl + request.getParameterString()).text(sessionID.toString());
        }
        b << "?";
      }
      {
        CENTER center(b);
        center.text();
        b << "[";
        {
          A a(b);
          a.href(request.toString() + "&confirm=1").text("YES, reset session");
        }
        b << "]" << NBSP << "[";
        {
          A a(b);
          a.href(sessionUrl).text("NO, do not reset session");
        }
        b << "]";
      }
    }
  } catch (std::exception &e) {
    b << e.what();
  }
}